

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CConvertVisitor.cpp
# Opt level: O0

void __thiscall CConvertVisitor::Visit(CConvertVisitor *this,CNumExp *exp)

{
  __cxx11 local_68 [48];
  PositionInfo local_38 [2];
  CNumExp *local_18;
  CNumExp *exp_local;
  CConvertVisitor *this_local;
  
  local_18 = exp;
  exp_local = (CNumExp *)this;
  PositionInfo::GetStringPosition_abi_cxx11_(local_38);
  std::__cxx11::string::operator+=((string *)&this->code,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::to_string(local_68,local_18->number);
  std::__cxx11::string::operator+=((string *)&this->code,(string *)local_68);
  std::__cxx11::string::~string((string *)local_68);
  return;
}

Assistant:

void CConvertVisitor::Visit(CNumExp &exp) {
	this->code += exp.position.GetStringPosition();
	this->code += std::to_string(exp.number);
}